

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

Token * __thiscall
wabt::WastLexer::GetStringToken(Token *__return_storage_ptr__,WastLexer *this,WastParser *parser)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  byte *pbVar4;
  Location loc;
  bool bVar5;
  uint uVar6;
  byte *pbVar7;
  bool bVar8;
  bool bVar9;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  if (this->cursor_ < this->buffer_end_) {
    this->cursor_ = this->cursor_ + 1;
  }
  pcVar2 = this->token_start_;
  bVar5 = true;
  bVar9 = false;
  bVar8 = bVar9;
LAB_0016e0f3:
  while( true ) {
    while( true ) {
      if (!bVar5) {
        this->token_start_ = pcVar2;
        if (bVar8) {
          GetLocation(this);
          loc.filename.size_._0_4_ = (int)uStack_48;
          loc.filename.data_ = (char *)local_50;
          loc.filename.size_._4_4_ = (int)((ulong)uStack_48 >> 0x20);
          loc.field_1.field_0.line = (int)local_40;
          loc.field_1.field_0.first_column = (int)((ulong)local_40 >> 0x20);
          loc.field_1.field_0.last_column = (int)uStack_38;
          loc.field_1._12_4_ = (int)((ulong)uStack_38 >> 0x20);
          Token::Token(__return_storage_ptr__,loc,First);
        }
        else {
          TextToken(__return_storage_ptr__,this,Text,0);
        }
        return __return_storage_ptr__;
      }
      pbVar3 = (byte *)this->buffer_end_;
      pbVar4 = (byte *)this->cursor_;
      if (pbVar3 <= pbVar4) {
        BareToken(__return_storage_ptr__,this,Eof);
        return __return_storage_ptr__;
      }
      pbVar7 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar7;
      bVar1 = *pbVar4;
      if (bVar1 != 10) break;
      this->token_start_ = (char *)pbVar4;
      GetLocation(this);
      WastParser::Error(parser,0x1a840d);
      this->line_ = this->line_ + 1;
      this->line_start_ = this->cursor_;
      bVar9 = true;
    }
    bVar8 = bVar9;
    if (bVar1 != 0x22) break;
    bVar5 = false;
  }
  if (bVar1 != 0x5c) goto LAB_0016e1fc;
  if (pbVar7 < pbVar3) {
    pbVar7 = pbVar4 + 2;
    this->cursor_ = (char *)pbVar7;
    uVar6 = pbVar4[1] - 0x22;
    if (0x3a < uVar6) goto LAB_0016e1bc;
    if ((0x1f80ffc000U >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto code_r0x0016e1a2;
    goto LAB_0016e1cc;
  }
  goto LAB_0016e226;
code_r0x0016e1a2:
  bVar5 = true;
  if ((0x400000000000021U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
LAB_0016e1bc:
    uVar6 = pbVar4[1] - 0x61;
    if (uVar6 < 0x14) {
      if ((0x3fU >> (uVar6 & 0x1f) & 1) == 0) {
        bVar5 = true;
        if ((0xa2000U >> (uVar6 & 0x1f) & 1) != 0) goto LAB_0016e0f3;
      }
      else {
LAB_0016e1cc:
        uVar6 = 0xffffffff;
        if (pbVar7 < pbVar3) {
          uVar6 = (uint)*pbVar7;
        }
        bVar5 = IsHexDigit(uVar6);
        pbVar7 = (byte *)this->cursor_;
        if (bVar5) {
          bVar5 = true;
          if (pbVar7 < this->buffer_end_) {
            this->cursor_ = (char *)(pbVar7 + 1);
LAB_0016e1fc:
            bVar5 = true;
          }
          goto LAB_0016e0f3;
        }
      }
    }
LAB_0016e226:
    this->token_start_ = (char *)(pbVar7 + -2);
    GetLocation(this);
    WastParser::Error(parser,0x1a841f,(char *)0x2);
    bVar9 = true;
    bVar5 = true;
    bVar8 = bVar9;
  }
  goto LAB_0016e0f3;
}

Assistant:

Token WastLexer::GetStringToken(WastParser* parser) {
  const char* saved_token_start = token_start_;
  bool has_error = false;
  bool in_string = true;
  ReadChar();
  while (in_string) {
    switch (ReadChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '\n':
        token_start_ = cursor_ - 1;
        ERROR("newline in string");
        has_error = true;
        Newline();
        continue;

      case '"':
        in_string = false;
        break;

      case '\\': {
        switch (ReadChar()) {
          case 't':
          case 'n':
          case 'r':
          case '"':
          case '\'':
          case '\\':
            // Valid escape.
            break;

          case '0':
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
          case 'a':
          case 'b':
          case 'c':
          case 'd':
          case 'e':
          case 'f':
          case 'A':
          case 'B':
          case 'C':
          case 'D':
          case 'E':
          case 'F':  // Hex byte escape.
            if (IsHexDigit(PeekChar())) {
              ReadChar();
            } else {
              token_start_ = cursor_ - 2;
              goto error;
            }
            break;

          default:
            token_start_ = cursor_ - 2;
            goto error;

          error:
            ERROR("bad escape \"%.*s\"",
                  static_cast<int>(cursor_ - token_start_), token_start_);
            has_error = true;
            break;
        }
        break;
      }
    }
  }
  token_start_ = saved_token_start;
  if (has_error) {
    return Token(GetLocation(), TokenType::Invalid);
  }

  return TextToken(TokenType::Text);
}